

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserLibxmlSaxParser.cpp
# Opt level: O0

void GeneratedSaxParser::LibxmlSaxParser::errorFunction(void *userData,char *msg,...)

{
  char in_AL;
  int iVar1;
  Parser *this;
  undefined8 in_RCX;
  String *in_RDX;
  String *in_RSI;
  SaxParser *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  IErrorHandler *errHandler;
  ParserError error;
  LibxmlSaxParser *thisObject;
  va_list argList;
  char *message;
  undefined8 in_stack_fffffffffffffe38;
  ParserError *in_stack_fffffffffffffe40;
  allocator<char> *columnNumber;
  String *additionalText;
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined1 local_188 [16];
  String *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  IErrorHandler *local_d0;
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [80];
  SaxParser *local_40;
  char local_38 [8];
  undefined1 *local_30;
  undefined1 *local_28;
  String *local_18;
  String *local_10;
  SaxParser *local_8;
  
  if (in_AL != '\0') {
    local_158 = in_XMM0_Qa;
    local_148 = in_XMM1_Qa;
    local_138 = in_XMM2_Qa;
    local_128 = in_XMM3_Qa;
    local_118 = in_XMM4_Qa;
    local_108 = in_XMM5_Qa;
    local_f8 = in_XMM6_Qa;
    local_e8 = in_XMM7_Qa;
  }
  local_18 = (String *)0x0;
  local_178 = in_RDX;
  local_170 = in_RCX;
  local_168 = in_R8;
  local_160 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = strcmp((char *)in_RSI,"%s");
  if (iVar1 == 0) {
    local_28 = local_188;
    local_30 = &stack0x00000008;
    in_stack_fffffffffffffe68 = local_38;
    in_stack_fffffffffffffe60 = (allocator<char> *)&local_178;
    local_38[4] = '0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[0] = '\x18';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    in_stack_fffffffffffffe74 = 0x10;
    local_18 = local_178;
  }
  local_40 = local_8;
  additionalText = local_10;
  if (local_18 != (String *)0x0) {
    additionalText = local_18;
  }
  columnNumber = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
             ,in_stack_fffffffffffffe60);
  ParserError::ParserError
            (in_stack_fffffffffffffe40,(Severity)((ulong)in_stack_fffffffffffffe38 >> 0x20),
             (ErrorType)in_stack_fffffffffffffe38,(char *)local_b0,(char *)0x0,0xc61595,
             (size_t)columnNumber,additionalText);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  this = SaxParser::getParser(local_40);
  local_d0 = Parser::getErrorHandler(this);
  if (local_d0 != (IErrorHandler *)0x0) {
    (*local_d0->_vptr_IErrorHandler[2])(local_d0,local_90);
  }
  ParserError::~ParserError((ParserError *)0xc61699);
  return;
}

Assistant:

void LibxmlSaxParser::errorFunction( void *userData, const char *msg, ... )
	{
        // if msg is just one string, get it. Otherwise ignore it.
        char* message = 0;
        va_list argList;
        if (strcmp(msg, "%s") == 0)
        {
            va_start(argList, msg); 
            message = va_arg(argList, char*);
        }

		LibxmlSaxParser* thisObject = (LibxmlSaxParser*)(userData);
		ParserError error(ParserError::SEVERITY_CRITICAL,
					ParserError::ERROR_XML_PARSER_ERROR,
					0,
					0,
					0,
					0,
                    message != 0 ? message : msg);

        if (message != 0)
        {
            va_end(argList);
        }

        IErrorHandler* errHandler = thisObject->getParser()->getErrorHandler();
        if ( errHandler ) 
            errHandler->handleError(error);
	}